

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_message.hpp
# Opt level: O2

void __thiscall
Catch::MessageInfo::MessageInfo
          (MessageInfo *this,string *_macroName,SourceLineInfo *_lineInfo,OfType _type)

{
  std::__cxx11::string::string((string *)this,(string *)_macroName);
  SourceLineInfo::SourceLineInfo(&this->lineInfo,_lineInfo);
  this->type = _type;
  (this->message)._M_dataplus._M_p = (pointer)&(this->message).field_2;
  (this->message)._M_string_length = 0;
  (this->message).field_2._M_local_buf[0] = '\0';
  globalCount = globalCount + 1;
  this->sequence = globalCount;
  return;
}

Assistant:

MessageInfo::MessageInfo(   std::string const& _macroName,
                                SourceLineInfo const& _lineInfo,
                                ResultWas::OfType _type )
    :   macroName( _macroName ),
        lineInfo( _lineInfo ),
        type( _type ),
        sequence( ++globalCount )
    {}